

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::SynthesizableVisitor::~SynthesizableVisitor(SynthesizableVisitor *this)

{
  SynthesizableVisitor *this_local;
  
  ~SynthesizableVisitor(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        if (stmt->has_delay()) {
            nodes_.emplace_back(stmt);
        }
    }